

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

bool can_see(CHAR_DATA *ch,CHAR_DATA *victim)

{
  short sVar1;
  AREA_DATA_conflict *pAVar2;
  bool bVar3;
  int iVar4;
  AREA_AFFECT_DATA *pAVar5;
  AFFECT_DATA *pAVar6;
  AFFECT_DATA *paf_find;
  AFFECT_DATA *pAVar7;
  AFFECT_DATA *pAVar8;
  
  bVar3 = is_npc(ch);
  if (bVar3) {
    if (ch == victim) {
      return true;
    }
    if ((ch->act[0] & 0x20000000U) != 0) {
      return true;
    }
  }
  else if (ch == victim) {
    return true;
  }
  bVar3 = is_immortal(ch);
  if ((bVar3) || (bVar3 = is_affected_by(victim,0x1e), !bVar3)) {
    bVar3 = is_cabal_guard(ch);
    if ((bVar3) && (ch->desc == (DESCRIPTOR_DATA *)0x0)) {
      return true;
    }
    iVar4 = get_trust(ch);
    if (((victim->invis_level <= iVar4) &&
        ((iVar4 = get_trust(ch), victim->incog_level <= iVar4 || (ch->in_room == victim->in_room))))
       && ((iVar4 = get_trust(ch), iVar4 != 0x33 ||
           ((victim->invis_level != 0x33 || (bVar3 = is_heroimm(ch), bVar3)))))) {
      bVar3 = is_npc(ch);
      if ((!bVar3) && ((ch->act[0] & 0x2000) != 0)) {
        return true;
      }
      bVar3 = is_npc(ch);
      if ((bVar3) && (bVar3 = is_immortal(ch), bVar3)) {
        return true;
      }
      bVar3 = is_npc(ch);
      if ((!bVar3) || (victim->invis_level < 0x33)) {
        bVar3 = is_npc(ch);
        if ((!bVar3) && (ch->pcdata->death_status == 8)) {
          return true;
        }
        bVar3 = is_cabal_guard(ch);
        if (bVar3) {
          return true;
        }
        bVar3 = is_affected_by(ch,0);
        if (bVar3) {
          return false;
        }
        pAVar6 = (AFFECT_DATA *)&victim->affected;
        pAVar7 = pAVar6;
        while (pAVar7 = pAVar7->next, pAVar7 != (AFFECT_DATA *)0x0) {
          if (pAVar7->type == gsn_ultradiffusion) {
            return false;
          }
        }
        pAVar2 = ch->in_room->area;
        pAVar7 = pAVar6;
        if (pAVar2 != (AREA_DATA_conflict *)0x0) {
          pAVar5 = (AREA_AFFECT_DATA *)&pAVar2->affected;
          do {
            pAVar5 = pAVar5->next;
            if (pAVar5 == (AREA_AFFECT_DATA *)0x0) goto LAB_0029fdd3;
          } while (pAVar5->type != gsn_whiteout);
          bVar3 = is_outside(ch);
          if (bVar3) {
            pAVar5 = (AREA_AFFECT_DATA *)&ch->in_room->area->affected;
            do {
              pAVar5 = pAVar5->next;
              if (pAVar5 == (AREA_AFFECT_DATA *)0x0) break;
            } while (pAVar5->type != gsn_whiteout);
            if (pAVar5->owner != ch) {
              return false;
            }
          }
        }
LAB_0029fdd3:
        do {
          pAVar7 = pAVar7->next;
          if (pAVar7 == (AFFECT_DATA *)0x0) goto LAB_0029fe19;
        } while (pAVar7->type != gsn_watermeld);
        if (ch != (CHAR_DATA *)0x0) {
          pAVar7 = (AFFECT_DATA *)&ch->affected;
          do {
            pAVar7 = pAVar7->next;
            if (pAVar7 == (AFFECT_DATA *)0x0) {
              return false;
            }
          } while (pAVar7->type != gsn_hydroperception);
LAB_0029fe19:
          while (pAVar6 = pAVar6->next, pAVar6 != (AFFECT_DATA *)0x0) {
            if (pAVar6->type == gsn_earthfade) {
              return false;
            }
          }
          bVar3 = is_affected_by(victim,1);
          if ((bVar3) && (bVar3 = is_affected_by(ch,3), !bVar3)) {
            if (ch == (CHAR_DATA *)0x0) {
              return false;
            }
            pAVar6 = (AFFECT_DATA *)&ch->affected;
            pAVar7 = pAVar6;
            do {
              pAVar7 = pAVar7->next;
              pAVar8 = pAVar6;
              if (pAVar7 == (AFFECT_DATA *)0x0) goto LAB_0029ff5b;
            } while (pAVar7->type != gsn_hydroperception);
            sVar1 = ch->in_room->sector_type;
            if (((sVar1 != 6) &&
                ((sVar1 == 7 || ((sVar1 != 8 && (victim->in_room->area->sky < 3)))))) ||
               (ch->in_room != victim->in_room)) {
LAB_0029ff5b:
              do {
                pAVar8 = pAVar8->next;
                if (pAVar8 == (AFFECT_DATA *)0x0) goto LAB_0029ff99;
              } while (pAVar8->type != gsn_sense_disturbance);
              if ((ch->in_room->sector_type == 8) || (victim->in_room->sector_type == 8)) {
LAB_0029ff99:
                do {
                  pAVar6 = pAVar6->next;
                  if (pAVar6 == (AFFECT_DATA *)0x0) {
                    return false;
                  }
                } while (pAVar6->type != gsn_sensevibrations);
                if ((victim->in_room->sector_type & 0xfffeU) == 8) {
                  return false;
                }
                if ((ch->in_room->sector_type & 0xfffeU) == 8) {
                  return false;
                }
                bVar3 = is_affected_by(victim,0xf);
                if (bVar3) {
                  return false;
                }
                bVar3 = is_affected_by(victim,0x13);
                if (bVar3) {
                  return false;
                }
              }
            }
          }
          bVar3 = is_affected_by(victim,0x10);
          if (((bVar3) && (bVar3 = is_affected_by(ch,5), !bVar3)) &&
             (victim->fighting == (CHAR_DATA *)0x0)) {
            if (ch == (CHAR_DATA *)0x0) {
              return false;
            }
            pAVar6 = (AFFECT_DATA *)&ch->affected;
            pAVar7 = pAVar6;
            do {
              pAVar7 = pAVar7->next;
              pAVar8 = pAVar6;
              if (pAVar7 == (AFFECT_DATA *)0x0) goto LAB_002a0075;
            } while (pAVar7->type != gsn_darksight);
            for (pAVar7 = *(AFFECT_DATA **)pAVar6; pAVar7 != (AFFECT_DATA *)0x0;
                pAVar7 = pAVar7->next) {
              if (pAVar7->type == gsn_darksight) {
                if ((pAVar7->aftype == 1) && (bVar3 = room_is_dark(victim->in_room), bVar3))
                goto LAB_0029fe80;
                break;
              }
            }
LAB_002a0075:
            do {
              pAVar8 = pAVar8->next;
              if (pAVar8 == (AFFECT_DATA *)0x0) goto LAB_002a00cc;
            } while (pAVar8->type != gsn_hydroperception);
            sVar1 = ch->in_room->sector_type;
            if (((sVar1 != 6) &&
                ((sVar1 == 7 || ((sVar1 != 8 && (victim->in_room->area->sky < 3)))))) ||
               (ch->in_room != victim->in_room)) {
LAB_002a00cc:
              do {
                pAVar6 = pAVar6->next;
                if (pAVar6 == (AFFECT_DATA *)0x0) {
                  return false;
                }
              } while (pAVar6->type != gsn_sensevibrations);
              if ((victim->in_room->sector_type & 0xfffeU) == 8) {
                return false;
              }
              if ((ch->in_room->sector_type & 0xfffeU) == 8) {
                return false;
              }
              bVar3 = is_affected_by(victim,0xf);
              if (bVar3) {
                return false;
              }
              bVar3 = is_affected_by(victim,0x13);
              if (bVar3) {
                return false;
              }
            }
          }
LAB_0029fe80:
          bVar3 = is_affected_by(victim,0xb);
          if ((!bVar3) || (bVar3 = is_affected_by(ch,8), bVar3)) {
            bVar3 = is_npc(ch);
            if (bVar3) {
              return true;
            }
            bVar3 = room_is_dark(ch->in_room);
            if (!bVar3) {
              return true;
            }
            bVar3 = is_affected_by(ch,0x19);
            if (bVar3) {
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool can_see(CHAR_DATA *ch, CHAR_DATA *victim)
{
	AREA_AFFECT_DATA *paf;
	AFFECT_DATA *af;

	if (is_npc(ch) && IS_SET(ch->act, ACT_DETECT_SPECIAL))
		return true;

	if (ch == victim)
		return true;

	if (!is_immortal(ch) && is_affected_by(victim, AFF_NOSHOW))
		return false;

	if (is_cabal_guard(ch) && !ch->desc)
		return true;

	if (get_trust(ch) < victim->invis_level)
		return false;

	if (get_trust(ch) < victim->incog_level && ch->in_room != victim->in_room)
		return false;

	if (get_trust(ch) == LEVEL_HERO && victim->invis_level == LEVEL_HERO && !is_heroimm(ch))
		return false;

	if ((!is_npc(ch) && IS_SET(ch->act, PLR_HOLYLIGHT)) || (is_npc(ch) && is_immortal(ch)))
		return true;

	if (is_npc(ch) && victim->invis_level >= LEVEL_HERO)
		return false;

	if (!is_npc(ch) && ch->pcdata->death_status == HAS_DIED)
		return true;

	/* Make sure cabal guardians can always see */
	if (is_cabal_guard(ch))
		return true;

	if (is_affected_by(ch, AFF_BLIND))
		return false;

	if (is_affected(victim, gsn_ultradiffusion))
		return false;

	if (is_affected_area(ch->in_room->area, gsn_whiteout) && is_outside(ch))
	{
		for (paf = ch->in_room->area->affected; paf; paf = paf->next)
		{
			if (paf->type == gsn_whiteout)
				break;
		}

		if (paf->owner != ch)
			return false;
	}

	if (is_affected(victim, gsn_watermeld) && !is_affected(ch, gsn_hydroperception))
		return false;

	if (is_affected(victim, gsn_earthfade))
		return false;

	if (is_affected_by(victim, AFF_INVISIBLE)
		&& !is_affected_by(ch, AFF_DETECT_INVIS)
		&& (!(is_affected(ch, gsn_hydroperception)
			&& (ch->in_room->sector_type == SECT_WATER
				|| ch->in_room->sector_type == SECT_UNDERWATER
				|| (ch->in_room->sector_type != SECT_INSIDE && victim->in_room->area->sky >= WeatherCondition::Drizzle))
			&& ch->in_room == victim->in_room))
		&& !(is_affected(ch, gsn_sense_disturbance)
			&& ch->in_room->sector_type != SECT_UNDERWATER
			&& victim->in_room->sector_type != SECT_UNDERWATER)
		&& (!(is_affected(ch, gsn_sensevibrations)
			&& victim->in_room->sector_type != SECT_UNDERWATER
			&& victim->in_room->sector_type != SECT_AIR
			&& ch->in_room->sector_type != SECT_UNDERWATER
			&& ch->in_room->sector_type != SECT_AIR
			&& !is_affected_by(victim, AFF_SNEAK)
			&& !is_affected_by(victim, AFF_FLYING))))
	{
		return false;
	}

	if (is_affected_by(victim, AFF_HIDE)
		&& !is_affected_by(ch, AFF_DETECT_HIDDEN)
		&& victim->fighting == nullptr
		&& !(is_affected(ch, gsn_darksight)
			&& (af = affect_find(ch->affected, gsn_darksight))
			&& af->aftype == AFT_SKILL
			&& room_is_dark(victim->in_room))
		&& !(is_affected(ch, gsn_hydroperception)
			&& (ch->in_room->sector_type == SECT_WATER
				|| ch->in_room->sector_type == SECT_UNDERWATER
				|| (ch->in_room->sector_type != SECT_INSIDE && victim->in_room->area->sky >= WeatherCondition::Drizzle))
			&& ch->in_room == victim->in_room)
		&& !(is_affected(ch, gsn_sensevibrations)
			&& victim->in_room->sector_type != SECT_UNDERWATER
			&& victim->in_room->sector_type != SECT_AIR
			&& ch->in_room->sector_type != SECT_UNDERWATER
			&& ch->in_room->sector_type != SECT_AIR
			&& !is_affected_by(victim, AFF_SNEAK)
			&& !is_affected_by(victim, AFF_FLYING)))
	{
		return false;
	}

	if (is_affected_by(victim, AFF_CAMOUFLAGE) && !is_affected_by(ch, AFF_DETECT_CAMO))
		return false;

	if (is_npc(ch))
		return true;

	if (room_is_dark(ch->in_room) && !is_affected_by(ch, AFF_DARK_VISION))
		return false;

	return true;
}